

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall cs::domain_manager::next_domain(domain_manager *this)

{
  domain_type *pdVar1;
  undefined8 *in_RDI;
  stack_type<cs::domain_type,_std::allocator> *in_stack_00000030;
  
  if (*(long *)*in_RDI == 0) {
    pdVar1 = stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000030);
    domain_type::next(pdVar1);
  }
  else {
    pdVar1 = stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000030);
    domain_type::next(pdVar1);
  }
  return;
}

Assistant:

void next_domain()
		{
			if (fiber_stack != nullptr)
				fiber_stack->top().next();
			else
				m_data.top().next();
		}